

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_unexpectedCustomTypeOutputParameter_Test::testBody
          (TEST_MockComparatorCopierTest_unexpectedCustomTypeOutputParameter_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  UtestShell *test;
  undefined4 extraout_var;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MyTypeForTesting actualObject;
  MyTypeForTestingCopier copier;
  MockUnexpectedOutputParameterFailure expectedFailure;
  MockNamedValue parameter;
  MockFailureReporterInstaller local_129;
  SimpleString local_128;
  SimpleString local_118;
  MockExpectedCallsList local_108;
  MyTypeForTesting local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  undefined **local_c8;
  TestFailure local_c0;
  MockNamedValue local_58;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_129);
  MyTypeForTesting::MyTypeForTesting(&local_f8,0x2282);
  local_c8 = &PTR__MockNamedValueCopier_002bc998;
  SimpleString::SimpleString((SimpleString *)&local_c0,"");
  pMVar2 = mock((SimpleString *)&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_58,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_58,&local_c8);
  SimpleString::~SimpleString((SimpleString *)&local_58);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_108);
  SimpleString::SimpleString((SimpleString *)&local_c0,"foo");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)&local_108,(SimpleString *)&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_c0,"parameterName");
  MockNamedValue::MockNamedValue(&local_58,(SimpleString *)&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_c0,"MyTypeForTesting");
  MockNamedValue::setConstObjectPointer(&local_58,(SimpleString *)&local_c0,&local_f8);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_128,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)&local_c0,test,&local_128,&local_58,&local_108)
  ;
  SimpleString::~SimpleString(&local_128);
  SimpleString::SimpleString(&local_128,"");
  pMVar2 = mock(&local_128,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_118,"foo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_118);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_128);
  SimpleString::SimpleString(&local_128,"");
  pMVar2 = mock(&local_128,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_118,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_118);
  SimpleString::SimpleString(&local_d8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_e8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar1),&local_d8,&local_e8,&local_f8);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_128);
  SimpleString::SimpleString(&local_128,"");
  pMVar2 = mock(&local_128,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_128);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0xd9);
  SimpleString::SimpleString(&local_128,"");
  pMVar2 = mock(&local_128,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_128);
  TestFailure::~TestFailure(&local_c0);
  MockNamedValue::~MockNamedValue(&local_58);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_108);
  MyTypeForTesting::~MyTypeForTesting(&local_f8);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_129);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, unexpectedCustomTypeOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting actualObject(8834);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo");
    MockNamedValue parameter("parameterName");
    parameter.setConstObjectPointer("MyTypeForTesting", &actualObject);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo");
    mock().actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}